

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9GenQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  int iVar7;
  uint fVerbose;
  char *pcVar8;
  uint local_4c;
  uint local_48;
  uint local_44;
  char *local_40;
  
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_44 = 6;
  uVar2 = 1;
  local_4c = 0;
  fVerbose = 0;
  local_48 = 1;
LAB_0025c87b:
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"FKNSovh");
      iVar7 = globalUtilOptind;
      if (iVar1 == 0x46) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_0025c9f1;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        uVar3 = uVar2;
        goto joined_r0x0025c997;
      }
      if (iVar1 == -1) {
        pGVar5 = pAbc->pGia;
        if (pGVar5 == (Gia_Man_t *)0x0) {
          pcVar6 = "There is no current GIA.\n";
        }
        else if (pGVar5->nRegs == 0) {
          pcVar6 = "Works only for sequential networks.\n";
        }
        else {
          if (pGVar5->nRegs < (int)(local_44 * local_48)) {
            Abc_Print(-1,"The number of flops (%d) is less than required (%d).\n");
            return 1;
          }
          if ((uVar2 == 1) && (local_48 == 1)) {
            pGVar5 = Gia_GenQbfMiter(pGVar5,1,1,local_44,local_40,local_4c,fVerbose);
            Abc_FrameUpdateGia(pAbc,pGVar5);
            free(local_40);
            return 0;
          }
          pcVar6 = "Currently this commands works for one frame and one LUT.\n";
        }
        iVar7 = -1;
        goto LAB_0025caa5;
      }
      if (iVar1 != 0x4b) break;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_0025c9f1:
        Abc_Print(-1,pcVar6);
        goto LAB_0025c9fb;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar3 = local_44;
joined_r0x0025c997:
      globalUtilOptind = iVar7 + 1;
      if ((int)uVar3 < 0) goto LAB_0025c9fb;
    }
    if (iVar1 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0025c9f1;
      }
      local_48 = atoi(argv[globalUtilOptind]);
      uVar3 = local_48;
      goto joined_r0x0025c997;
    }
    if (iVar1 != 0x53) {
      if (iVar1 == 0x6f) {
        local_4c = local_4c ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0025c9fb;
        fVerbose = fVerbose ^ 1;
      }
      goto LAB_0025c87b;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a string.\n");
      goto LAB_0025c9fb;
    }
    pcVar6 = argv[globalUtilOptind];
    if (pcVar6 == (char *)0x0) {
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0025c9fb;
    }
    sVar4 = strlen(pcVar6);
    local_40 = (char *)malloc(sVar4 + 1);
    strcpy(local_40,pcVar6);
    globalUtilOptind = iVar7 + 1;
    if (local_40 == (char *)0x0) {
LAB_0025c9fb:
      iVar7 = -2;
      Abc_Print(-2,"usage: &genqbf [-FKN num] [-ovh]\n");
      Abc_Print(-2,"\t         generates QBF miter for computing an inductive invariant\n");
      Abc_Print(-2,"\t-F num : the number of time frames for induction [default = %d]\n",
                (ulong)uVar2);
      Abc_Print(-2,"\t-K num : the LUT size [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-N num : the number of LUTs [default = %d]\n",(ulong)local_48);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (local_4c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle using the last output [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
      pcVar6 = "\t-h     : print the command usage\n";
LAB_0025caa5:
      Abc_Print(iVar7,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GenQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * pGia, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose );
    int nFrames   =    1;
    int nLutNum   =    1;
    int nLutSize  =    6;
    char * pStr   = NULL;
    int fUseOut   =    0;
    int fVerbose  =    0;
    int c;
    Gia_Man_t * pTemp;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FKNSovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutNum < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a string.\n" );
                goto usage;
            }
            pStr = Abc_UtilStrsav(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pStr == NULL )
                goto usage;
            break;
        case 'o':
            fUseOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Works only for sequential networks.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) < nLutSize * nLutNum )
    {
        Abc_Print( -1, "The number of flops (%d) is less than required (%d).\n", Gia_ManRegNum(pAbc->pGia), nLutSize * nLutNum );
        return 1;
    }
    if ( nFrames != 1 || nLutNum != 1 )
    {
        Abc_Print( -1, "Currently this commands works for one frame and one LUT.\n" );
        return 1;
    }
    pTemp = Gia_GenQbfMiter( pAbc->pGia, nFrames, nLutNum, nLutSize, pStr, fUseOut, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    ABC_FREE( pStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &genqbf [-FKN num] [-ovh]\n" );
    Abc_Print( -2, "\t         generates QBF miter for computing an inductive invariant\n" );
    Abc_Print( -2, "\t-F num : the number of time frames for induction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-K num : the LUT size [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-N num : the number of LUTs [default = %d]\n", nLutNum );
    Abc_Print( -2, "\t-o     : toggle using the last output [default = %s]\n", fUseOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}